

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3423::SetNodes
          (ChElementShellANCF_3423 *this,shared_ptr<chrono::fea::ChNodeFEAxyzD> *nodeA,
          shared_ptr<chrono::fea::ChNodeFEAxyzD> *nodeB,
          shared_ptr<chrono::fea::ChNodeFEAxyzD> *nodeC,
          shared_ptr<chrono::fea::ChNodeFEAxyzD> *nodeD)

{
  ChMatrixNM<double,_8,_3> *d;
  element_type *peVar1;
  pointer psVar2;
  long lVar3;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> mvars;
  type tmp;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_2c0;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_2a8;
  ChMatrixNM<double,_8,_3> *local_290;
  Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_> local_288;
  Matrix<double,_8,_8,_0,_8,_8> local_280;
  
  peVar1 = (nodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    __assert_fail("nodeA",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementShellANCF_3423.cpp"
                  ,0x37,
                  "void chrono::fea::ChElementShellANCF_3423::SetNodes(std::shared_ptr<ChNodeFEAxyzD>, std::shared_ptr<ChNodeFEAxyzD>, std::shared_ptr<ChNodeFEAxyzD>, std::shared_ptr<ChNodeFEAxyzD>)"
                 );
  }
  if ((nodeB->super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    __assert_fail("nodeB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementShellANCF_3423.cpp"
                  ,0x38,
                  "void chrono::fea::ChElementShellANCF_3423::SetNodes(std::shared_ptr<ChNodeFEAxyzD>, std::shared_ptr<ChNodeFEAxyzD>, std::shared_ptr<ChNodeFEAxyzD>, std::shared_ptr<ChNodeFEAxyzD>)"
                 );
  }
  if ((nodeC->super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    __assert_fail("nodeC",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementShellANCF_3423.cpp"
                  ,0x39,
                  "void chrono::fea::ChElementShellANCF_3423::SetNodes(std::shared_ptr<ChNodeFEAxyzD>, std::shared_ptr<ChNodeFEAxyzD>, std::shared_ptr<ChNodeFEAxyzD>, std::shared_ptr<ChNodeFEAxyzD>)"
                 );
  }
  if ((nodeD->super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    psVar2 = (this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (psVar2->super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         peVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(psVar2->super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>)
                ._M_refcount,
               &(nodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount);
    psVar2 = (this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar2[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (nodeB->super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&psVar2[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               &(nodeB->super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount);
    psVar2 = (this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar2[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (nodeC->super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&psVar2[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               &(nodeC->super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount);
    psVar2 = (this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar2[3].super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (nodeD->super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&psVar2[3].super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               &(nodeD->super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount);
    local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (ChVariables **)0x0;
    local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (ChVariables **)0x0;
    local_280.super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>.m_storage.m_data.array[0]
         = (double)(**(code **)(*(long *)&((((this->m_nodes).
                                             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_ptr)->super_ChNodeFEAxyz + 0x40))();
    if (local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
      _M_realloc_insert<chrono::ChVariables*>
                ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_2c0,
                 (iterator)
                 local_2c0.
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ChVariables **)&local_280);
    }
    else {
      *local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           (ChVariables *)
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>.m_storage.m_data.
           array[0];
      local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_2c0.
           super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
           .super__Vector_impl_data._M_finish + 1;
    }
    local_280.super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>.m_storage.m_data.array[0]
         = *(double *)
            ((long)&((((this->m_nodes).
                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->super_ChNodeFEAxyz + 0xe8);
    if (local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
      _M_realloc_insert<chrono::ChVariables*>
                ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_2c0,
                 (iterator)
                 local_2c0.
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ChVariables **)&local_280);
    }
    else {
      *local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           (ChVariables *)
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>.m_storage.m_data.
           array[0];
      local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_2c0.
           super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
           .super__Vector_impl_data._M_finish + 1;
    }
    local_280.super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>.m_storage.m_data.array[0]
         = (double)(**(code **)(*(long *)&((this->m_nodes).
                                           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[1].
                                           super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->super_ChNodeFEAxyz + 0x40))();
    if (local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
      _M_realloc_insert<chrono::ChVariables*>
                ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_2c0,
                 (iterator)
                 local_2c0.
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ChVariables **)&local_280);
    }
    else {
      *local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           (ChVariables *)
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>.m_storage.m_data.
           array[0];
      local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_2c0.
           super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
           .super__Vector_impl_data._M_finish + 1;
    }
    local_280.super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>.m_storage.m_data.array[0]
         = *(double *)
            ((long)&((this->m_nodes).
                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].
                     super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_ChNodeFEAxyz + 0xe8);
    if (local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
      _M_realloc_insert<chrono::ChVariables*>
                ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_2c0,
                 (iterator)
                 local_2c0.
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ChVariables **)&local_280);
    }
    else {
      *local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           (ChVariables *)
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>.m_storage.m_data.
           array[0];
      local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_2c0.
           super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
           .super__Vector_impl_data._M_finish + 1;
    }
    local_280.super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>.m_storage.m_data.array[0]
         = (double)(**(code **)(*(long *)&((this->m_nodes).
                                           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[2].
                                           super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->super_ChNodeFEAxyz + 0x40))();
    if (local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
      _M_realloc_insert<chrono::ChVariables*>
                ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_2c0,
                 (iterator)
                 local_2c0.
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ChVariables **)&local_280);
    }
    else {
      *local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           (ChVariables *)
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>.m_storage.m_data.
           array[0];
      local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_2c0.
           super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
           .super__Vector_impl_data._M_finish + 1;
    }
    local_280.super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>.m_storage.m_data.array[0]
         = *(double *)
            ((long)&((this->m_nodes).
                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[2].
                     super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_ChNodeFEAxyz + 0xe8);
    if (local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
      _M_realloc_insert<chrono::ChVariables*>
                ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_2c0,
                 (iterator)
                 local_2c0.
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ChVariables **)&local_280);
    }
    else {
      *local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           (ChVariables *)
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>.m_storage.m_data.
           array[0];
      local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_2c0.
           super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
           .super__Vector_impl_data._M_finish + 1;
    }
    local_280.super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>.m_storage.m_data.array[0]
         = (double)(**(code **)(*(long *)&((this->m_nodes).
                                           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[3].
                                           super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->super_ChNodeFEAxyz + 0x40))();
    if (local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
      _M_realloc_insert<chrono::ChVariables*>
                ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_2c0,
                 (iterator)
                 local_2c0.
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ChVariables **)&local_280);
    }
    else {
      *local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           (ChVariables *)
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>.m_storage.m_data.
           array[0];
      local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_2c0.
           super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
           .super__Vector_impl_data._M_finish + 1;
    }
    local_280.super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>.m_storage.m_data.array[0]
         = *(double *)
            ((long)&((this->m_nodes).
                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[3].
                     super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_ChNodeFEAxyz + 0xe8);
    if (local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
      _M_realloc_insert<chrono::ChVariables*>
                ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_2c0,
                 (iterator)
                 local_2c0.
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ChVariables **)&local_280);
    }
    else {
      *local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           (ChVariables *)
           local_280.super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>.m_storage.m_data.
           array[0];
      local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_2c0.
           super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
           .super__Vector_impl_data._M_finish + 1;
    }
    std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
              (&local_2a8,&local_2c0);
    ChKblockGeneric::SetVariables
              (&(this->super_ChElementShell).super_ChElementGeneric.Kmatr,&local_2a8);
    if (local_2a8.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a8.
                      super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_2a8.
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a8.
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    d = &this->m_d0;
    CalcCoordMatrix(this,d);
    local_290 = d;
    local_288.m_matrix = d;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,8,3,1,8,3>,Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::evalTo<Eigen::Matrix<double,8,8,0,8,8>>(&local_280,d,&local_288);
    lVar3 = 0;
    do {
      (this->m_d0d0T).super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_1,_8,_8>_>.m_storage.m_data.
      array[lVar3] = *(double *)
                      ((long)local_280.super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>.
                             m_storage.m_data.array + lVar3);
      (this->m_d0d0T).super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_1,_8,_8>_>.m_storage.m_data.
      array[lVar3 + 1] =
           *(double *)
            ((long)local_280.super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>.m_storage.
                   m_data.array + lVar3 + 0x40);
      (this->m_d0d0T).super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_1,_8,_8>_>.m_storage.m_data.
      array[lVar3 + 2] =
           *(double *)
            ((long)local_280.super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>.m_storage.
                   m_data.array + lVar3 + 0x80);
      (this->m_d0d0T).super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_1,_8,_8>_>.m_storage.m_data.
      array[lVar3 + 3] =
           *(double *)
            ((long)local_280.super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>.m_storage.
                   m_data.array + lVar3 + 0xc0);
      (this->m_d0d0T).super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_1,_8,_8>_>.m_storage.m_data.
      array[lVar3 + 4] =
           *(double *)
            ((long)local_280.super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>.m_storage.
                   m_data.array + lVar3 + 0x100);
      (this->m_d0d0T).super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_1,_8,_8>_>.m_storage.m_data.
      array[lVar3 + 5] =
           *(double *)
            ((long)local_280.super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>.m_storage.
                   m_data.array + lVar3 + 0x140);
      (this->m_d0d0T).super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_1,_8,_8>_>.m_storage.m_data.
      array[lVar3 + 6] =
           *(double *)
            ((long)local_280.super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>.m_storage.
                   m_data.array + lVar3 + 0x180);
      (this->m_d0d0T).super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_1,_8,_8>_>.m_storage.m_data.
      array[lVar3 + 7] =
           *(double *)
            ((long)local_280.super_PlainObjectBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>.m_storage.
                   m_data.array + lVar3 + 0x1c0);
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x40);
    if (local_2c0.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2c0.
                      super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_2c0.
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2c0.
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  __assert_fail("nodeD",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementShellANCF_3423.cpp"
                ,0x3a,
                "void chrono::fea::ChElementShellANCF_3423::SetNodes(std::shared_ptr<ChNodeFEAxyzD>, std::shared_ptr<ChNodeFEAxyzD>, std::shared_ptr<ChNodeFEAxyzD>, std::shared_ptr<ChNodeFEAxyzD>)"
               );
}

Assistant:

void ChElementShellANCF_3423::SetNodes(std::shared_ptr<ChNodeFEAxyzD> nodeA,
                                       std::shared_ptr<ChNodeFEAxyzD> nodeB,
                                       std::shared_ptr<ChNodeFEAxyzD> nodeC,
                                       std::shared_ptr<ChNodeFEAxyzD> nodeD) {
    assert(nodeA);
    assert(nodeB);
    assert(nodeC);
    assert(nodeD);

    m_nodes[0] = nodeA;
    m_nodes[1] = nodeB;
    m_nodes[2] = nodeC;
    m_nodes[3] = nodeD;
    std::vector<ChVariables*> mvars;
    mvars.push_back(&m_nodes[0]->Variables());
    mvars.push_back(&m_nodes[0]->Variables_D());
    mvars.push_back(&m_nodes[1]->Variables());
    mvars.push_back(&m_nodes[1]->Variables_D());
    mvars.push_back(&m_nodes[2]->Variables());
    mvars.push_back(&m_nodes[2]->Variables_D());
    mvars.push_back(&m_nodes[3]->Variables());
    mvars.push_back(&m_nodes[3]->Variables_D());
    Kmatr.SetVariables(mvars);

    // Initial positions and slopes of the element nodes
    CalcCoordMatrix(m_d0);
    m_d0d0T = m_d0 * m_d0.transpose();
}